

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void SQCollectable::RemoveFromChain(SQCollectable_conflict **chain,SQCollectable_conflict *c)

{
  SQCollectable_conflict *c_local;
  SQCollectable_conflict **chain_local;
  
  if (c->_prev == (SQCollectable_conflict *)0x0) {
    *chain = c->_next;
  }
  else {
    c->_prev->_next = c->_next;
  }
  if (c->_next != (SQCollectable_conflict *)0x0) {
    c->_next->_prev = c->_prev;
  }
  c->_next = (SQCollectable_conflict *)0x0;
  c->_prev = (SQCollectable_conflict *)0x0;
  return;
}

Assistant:

void SQCollectable::RemoveFromChain(SQCollectable **chain,SQCollectable *c)
{
    if(c->_prev) c->_prev->_next = c->_next;
    else *chain = c->_next;
    if(c->_next)
        c->_next->_prev = c->_prev;
    c->_next = NULL;
    c->_prev = NULL;
}